

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getopt_pp.h
# Opt level: O2

Result __thiscall
GetOpt::OptionPresent::operator()
          (OptionPresent *this,ShortOptions *short_ops,LongOptions *long_ops,Token *param_3,
          fmtflags param_4)

{
  bool bVar1;
  Result RVar2;
  iterator iVar3;
  _Base_ptr p_Var4;
  iterator iVar5;
  
  iVar3 = std::
          _Rb_tree<char,_std::pair<const_char,_GetOpt::OptionData>,_std::_Select1st<std::pair<const_char,_GetOpt::OptionData>_>,_std::less<char>,_std::allocator<std::pair<const_char,_GetOpt::OptionData>_>_>
          ::find(&short_ops->_M_t,&this->short_opt);
  if ((_Rb_tree_header *)iVar3._M_node == &(short_ops->_M_t)._M_impl.super__Rb_tree_header) {
    if ((this->long_opt)._M_string_length != 0) {
      iVar5 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GetOpt::OptionData>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GetOpt::OptionData>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GetOpt::OptionData>_>_>
              ::find(&long_ops->_M_t,&this->long_opt);
      if ((_Rb_tree_header *)iVar5._M_node != &(long_ops->_M_t)._M_impl.super__Rb_tree_header) {
        p_Var4 = iVar5._M_node + 2;
        goto LAB_00103d43;
      }
    }
    bVar1 = false;
  }
  else {
    p_Var4 = (_Base_ptr)&iVar3._M_node[1]._M_parent;
LAB_00103d43:
    p_Var4->_M_color = 1;
    bVar1 = true;
  }
  if (this->present == (bool *)0x0) {
    RVar2 = OptionNotFound_NoEx;
    if (bVar1 != false) {
      RVar2 = OK;
    }
  }
  else {
    *this->present = bVar1;
    RVar2 = OK;
  }
  return RVar2;
}

Assistant:

virtual Result operator()(ShortOptions& short_ops, LongOptions& long_ops, Token* /*first*/, std::ios::fmtflags /*flags*/) const
    {
        bool found;
        ShortOptions::iterator it = short_ops.find(short_opt);

        found = (it != short_ops.end());
        if (found)
        {
            it->second.flags = OptionData::CmdLine_Extracted;
        }
        else if (!long_opt.empty())
        {
            LongOptions::iterator it = long_ops.find(long_opt);
            found = (it != long_ops.end());
            if (found)
            {
                it->second.flags = OptionData::CmdLine_Extracted;
            }
        }

        if (present != NULL)
        {
            *present = found;
            return OK;
        }
        else
        {
            return found ? OK : OptionNotFound_NoEx;
        }
    }